

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-trait.c
# Opt level: O0

void borg_notice(_Bool notice_swap)

{
  bool local_22;
  bool local_21;
  bool local_20;
  bool local_1f;
  bool local_1e;
  bool local_1d;
  bool local_1c;
  bool local_1b;
  bool local_1a;
  bool local_19;
  bool local_18;
  bool local_17;
  bool local_16;
  _Bool local_15;
  _Bool local_14;
  _Bool local_13;
  _Bool local_12;
  _Bool local_11;
  wchar_t total_big_heal;
  _Bool notice_swap_local;
  
  memset(borg.has,0,(ulong)z_info->k_max << 2);
  memset(borg.trait,0,0x424);
  memset(borg.activation,0,(ulong)z_info->act_max << 2);
  borg.trait[0x92] = 1;
  borg.trait[0x2c] = 0x6e;
  borg.trait[0x98] = -1;
  borg.trait[0x99] = 4;
  borg_notice_player();
  if ((borg_do_spell & 1U) != 0) {
    borg_cheat_spells();
    borg_do_spell = false;
  }
  borg_notice_equipment();
  borg_notice_inventory();
  if (notice_swap) {
    borg_notice_weapon_swap();
    borg_notice_armour_swap();
  }
  local_11 = true;
  if (((borg.trait[0x48] == 0) && (local_11 = true, armour_swap_resist_acid == '\0')) &&
     (local_11 = true, weapon_swap_resist_acid == '\0')) {
    local_11 = borg_spell_legal_fail(RESISTANCE,0xf);
  }
  borg.trait[0x5a] = (uint)local_11;
  local_12 = true;
  if (((borg.trait[0x47] == 0) && (local_12 = true, armour_swap_resist_elec == '\0')) &&
     (local_12 = true, weapon_swap_resist_elec == '\0')) {
    local_12 = borg_spell_legal_fail(RESISTANCE,0xf);
  }
  borg.trait[0x59] = (uint)local_12;
  local_13 = true;
  if (((borg.trait[0x45] == 0) && (local_13 = true, armour_swap_resist_fire == '\0')) &&
     (local_13 = true, weapon_swap_resist_fire == '\0')) {
    local_13 = borg_spell_legal_fail(RESISTANCE,0xf);
  }
  borg.trait[0x57] = (uint)local_13;
  local_14 = true;
  if (((borg.trait[0x46] == 0) && (local_14 = true, armour_swap_resist_cold == '\0')) &&
     (local_14 = true, weapon_swap_resist_cold == '\0')) {
    local_14 = borg_spell_legal_fail(RESISTANCE,0xf);
  }
  borg.trait[0x58] = (uint)local_14;
  local_15 = true;
  if (((borg.trait[0x49] == 0) && (local_15 = true, armour_swap_resist_pois == '\0')) &&
     (local_15 = true, weapon_swap_resist_pois == '\0')) {
    local_15 = borg_spell_legal_fail(RESIST_POISON,0xf);
  }
  borg.trait[0x5b] = (uint)local_15;
  local_16 = true;
  if ((borg.trait[0x4a] == 0) && (local_16 = true, armour_swap_resist_fear == '\0')) {
    local_16 = weapon_swap_resist_fear != '\0';
  }
  borg.trait[0x5c] = (uint)local_16;
  local_17 = true;
  if ((borg.trait[0x4b] == 0) && (local_17 = true, armour_swap_resist_light == '\0')) {
    local_17 = weapon_swap_resist_light != '\0';
  }
  borg.trait[0x5d] = (uint)local_17;
  local_18 = true;
  if ((borg.trait[0x4c] == 0) && (local_18 = true, armour_swap_resist_dark == '\0')) {
    local_18 = weapon_swap_resist_dark != '\0';
  }
  borg.trait[0x5e] = (uint)local_18;
  local_19 = true;
  if ((borg.trait[0x4d] == 0) && (local_19 = true, armour_swap_resist_blind == '\0')) {
    local_19 = weapon_swap_resist_blind != '\0';
  }
  borg.trait[0x5f] = (uint)local_19;
  local_1a = true;
  if ((borg.trait[0x4e] == 0) && (local_1a = true, armour_swap_resist_conf == '\0')) {
    local_1a = weapon_swap_resist_conf != '\0';
  }
  borg.trait[0x60] = (uint)local_1a;
  local_1b = true;
  if ((borg.trait[0x4f] == 0) && (local_1b = true, armour_swap_resist_sound == '\0')) {
    local_1b = weapon_swap_resist_sound != '\0';
  }
  borg.trait[0x61] = (uint)local_1b;
  local_1c = true;
  if ((borg.trait[0x50] == 0) && (local_1c = true, armour_swap_resist_shard == '\0')) {
    local_1c = weapon_swap_resist_shard != '\0';
  }
  borg.trait[0x62] = (uint)local_1c;
  local_1d = true;
  if ((borg.trait[0x51] == 0) && (local_1d = true, armour_swap_resist_nexus == '\0')) {
    local_1d = weapon_swap_resist_nexus != '\0';
  }
  borg.trait[99] = (uint)local_1d;
  local_1e = true;
  if ((borg.trait[0x52] == 0) && (local_1e = true, armour_swap_resist_neth == '\0')) {
    local_1e = weapon_swap_resist_neth != '\0';
  }
  borg.trait[100] = (uint)local_1e;
  local_1f = true;
  if ((borg.trait[0x53] == 0) && (local_1f = true, armour_swap_resist_chaos == '\0')) {
    local_1f = weapon_swap_resist_chaos != '\0';
  }
  borg.trait[0x65] = (uint)local_1f;
  local_20 = true;
  if ((borg.trait[0x54] == 0) && (local_20 = true, armour_swap_resist_disen == '\0')) {
    local_20 = weapon_swap_resist_disen != '\0';
  }
  borg.trait[0x66] = (uint)local_20;
  local_21 = true;
  if ((borg.trait[0x55] == 0) && (local_21 = true, armour_swap_hold_life == '\0')) {
    local_21 = weapon_swap_hold_life != '\0';
  }
  borg.trait[0x67] = (uint)local_21;
  local_22 = true;
  if ((borg.trait[0x56] == 0) && (local_22 = true, armour_swap_free_act == '\0')) {
    local_22 = weapon_swap_free_act != '\0';
  }
  borg.trait[0x68] = (uint)local_22;
  borg.trait[0x105] = borg_adj_str_wgt[borg.trait[0xf]] * 100;
  if (borg.trait[0x105] / 2 < borg.trait[0x104]) {
    borg.trait[0x2c] =
         borg.trait[0x2c] - (borg.trait[0x104] - borg.trait[0x105] / 2) / (borg.trait[0x105] / 10);
  }
  if (199 < borg.trait[0x2c]) {
    borg.trait[0x2c] = 199;
  }
  if (borg.trait[0x2c] < 0x6f) {
    borg_game_ratio = 1000;
  }
  else {
    borg_game_ratio = (int16_t)(100000 / (long)((borg.trait[0x2c] + -0x6e) * 10 + 100));
  }
  borg.trait[0x108] = 0;
  if ((0x62 < borg.trait[0x6a]) &&
     ((borg_notice_home((borg_item_conflict *)0x0,false),
      (int)num_life_true +
      (int)num_ezheal_true +
      (int)num_heal_true + borg.trait[0xd8] + borg.trait[0xd7] + borg.has[kv_potion_healing] < 0x1e
      || ((int)num_speed + borg.trait[0xda] < 0xf)))) {
    borg.trait[0x108] = 1;
  }
  return;
}

Assistant:

void borg_notice(bool notice_swap)
{
    /* Clear out trait arrays */
    memset(borg.has, 0, z_info->k_max * sizeof(int));
    memset(borg.trait, 0, BI_MAX * sizeof(int));
    memset(borg.activation, 0, z_info->act_max * sizeof(int));

    /* Start with a single blow per turn */
    borg.trait[BI_BLOWS] = 1;

    /* speed starts at 110 */
    borg.trait[BI_SPEED] = 110;

    /* Reset the "ammo" attributes */
    borg.trait[BI_AMMO_TVAL] = -1;
    borg.trait[BI_AMMO_SIDES] = 4;

    /* Many of our variables are tied to borg.trait[], which is erased at the
     * the start of borg_notice().  So we must update the frame the cheat in
     * all the non inventory skills.
     */
    borg_notice_player();

    /*** Process books/spells ***/
    if (borg_do_spell) {
        borg_cheat_spells();
        borg_do_spell = false;
    }

    /* Notice the equipment */
    borg_notice_equipment();

    /* Notice the inventory */
    borg_notice_inventory();

    /* Notice and locate my swap weapon */
    if (notice_swap) {
        borg_notice_weapon_swap();
        borg_notice_armour_swap();
    }
    borg.trait[BI_SRACID]
        = borg.trait[BI_RACID] || armour_swap_resist_acid
          || weapon_swap_resist_acid
          || borg_spell_legal_fail(RESISTANCE, 15); /* Res FECAP */
    borg.trait[BI_SRELEC]
        = borg.trait[BI_RELEC] || armour_swap_resist_elec
          || weapon_swap_resist_elec
          || borg_spell_legal_fail(RESISTANCE, 15); /* Res FECAP */
    borg.trait[BI_SRFIRE]
        = borg.trait[BI_RFIRE] || armour_swap_resist_fire
          || weapon_swap_resist_fire
          || borg_spell_legal_fail(RESISTANCE, 15); /* Res FECAP */
    borg.trait[BI_SRCOLD]
        = borg.trait[BI_RCOLD] || armour_swap_resist_cold
          || weapon_swap_resist_cold
          || borg_spell_legal_fail(RESISTANCE, 15); /* Res FECAP */
    borg.trait[BI_SRPOIS]
        = borg.trait[BI_RPOIS] || armour_swap_resist_pois
          || weapon_swap_resist_pois
          || borg_spell_legal_fail(RESIST_POISON, 15); /* Res P */
    borg.trait[BI_SRFEAR] = borg.trait[BI_RFEAR] || armour_swap_resist_fear
                            || weapon_swap_resist_fear;
    borg.trait[BI_SRLITE] = borg.trait[BI_RLITE] || armour_swap_resist_light
                            || weapon_swap_resist_light;
    borg.trait[BI_SRDARK] = borg.trait[BI_RDARK] || armour_swap_resist_dark
                            || weapon_swap_resist_dark;
    borg.trait[BI_SRBLIND] = borg.trait[BI_RBLIND] || armour_swap_resist_blind
                             || weapon_swap_resist_blind;
    borg.trait[BI_SRCONF] = borg.trait[BI_RCONF] || armour_swap_resist_conf
                            || weapon_swap_resist_conf;
    borg.trait[BI_SRSND] = borg.trait[BI_RSND] || armour_swap_resist_sound
                           || weapon_swap_resist_sound;
    borg.trait[BI_SRSHRD] = borg.trait[BI_RSHRD] || armour_swap_resist_shard
                            || weapon_swap_resist_shard;
    borg.trait[BI_SRNXUS] = borg.trait[BI_RNXUS] || armour_swap_resist_nexus
                            || weapon_swap_resist_nexus;
    borg.trait[BI_SRNTHR] = borg.trait[BI_RNTHR] || armour_swap_resist_neth
                            || weapon_swap_resist_neth;
    borg.trait[BI_SRKAOS] = borg.trait[BI_RKAOS] || armour_swap_resist_chaos
                            || weapon_swap_resist_chaos;
    borg.trait[BI_SRDIS] = borg.trait[BI_RDIS] || armour_swap_resist_disen
                           || weapon_swap_resist_disen;
    borg.trait[BI_SHLIFE] = borg.trait[BI_HLIFE] || armour_swap_hold_life
                            || weapon_swap_hold_life;
    borg.trait[BI_SFRACT]
        = borg.trait[BI_FRACT] || armour_swap_free_act || weapon_swap_free_act;

    /* Apply "encumbrance" from weight */
    /* Extract the "weight limit" (in tenth pounds) */
    borg.trait[BI_CARRY] = borg_adj_str_wgt[borg.trait[BI_STR_INDEX]] * 100;

    /* Apply "encumbrance" from weight */
    if (borg.trait[BI_WEIGHT] > borg.trait[BI_CARRY] / 2)
        borg.trait[BI_SPEED]
            -= ((borg.trait[BI_WEIGHT] - (borg.trait[BI_CARRY] / 2))
                / (borg.trait[BI_CARRY] / 10));

    /* top speed */
    if (borg.trait[BI_SPEED] > 199)
        borg.trait[BI_SPEED] = 199;

    /* Check my ratio for decrementing variables */
    if (borg.trait[BI_SPEED] > 110) {
        borg_game_ratio = 100000 / (((borg.trait[BI_SPEED] - 110) * 10) + 100);
    } else {
        borg_game_ratio = 1000;
    }

    /* set if we are preparing for fighting morgoth or sauron */
    borg.trait[BI_PREP_BIG_FIGHT] = false;
    if (borg.trait[BI_MAXDEPTH] >= 99) {

        /* Examine the home */
        borg_notice_home(NULL, false);

        /* pot of healing + *healing* + life */
        int total_big_heal = borg.has[kv_potion_healing];
        total_big_heal += borg.trait[BI_AEZHEAL];
        total_big_heal += borg.trait[BI_ALIFE];

        /* plus the same at home */
        total_big_heal += num_heal_true;
        total_big_heal += num_ezheal_true;
        total_big_heal += num_life_true;

        /* want bunches of heal and speed to feel prepped for the fight */
        if (total_big_heal < 30 || (num_speed + borg.trait[BI_ASPEED]) < 15)
            borg.trait[BI_PREP_BIG_FIGHT] = true;
    }
}